

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O2

void ppc_hash64_filter_pagesizes
               (PowerPCCPU_conflict3 *cpu,_func__Bool_void_ptr_uint32_t_uint32_t *cb,void *opaque)

{
  PPCHash64Options *pPVar1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  PPCHash64SegmentPageSizes *pPVar7;
  PPCHash64PageSize *pPVar8;
  long lVar9;
  int iVar10;
  
  pPVar1 = cpu->hash64_opts;
  if (pPVar1 == (PPCHash64Options *)0x0) {
    __assert_fail("opts",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                  ,0x4db,
                  "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                 );
  }
  pPVar8 = pPVar1->sps[0].enc;
  bVar5 = false;
  uVar4 = 0;
  for (uVar6 = 0; uVar6 != 8; uVar6 = uVar6 + 1) {
    if (uVar6 < uVar4) {
      __assert_fail("n <= i",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                    ,0x4e3,
                    "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                   );
    }
    pPVar7 = pPVar1->sps + uVar6;
    if (pPVar7->page_shift == 0) break;
    uVar3 = 0;
    for (lVar9 = 0; iVar10 = (int)uVar3, lVar9 != 8; lVar9 = lVar9 + 1) {
      if (lVar9 < iVar10) {
        __assert_fail("m <= j",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                      ,0x4ec,
                      "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                     );
      }
      if (pPVar8[lVar9].page_shift == 0) break;
      _Var2 = (*cb)(opaque,pPVar7->page_shift,pPVar8[lVar9].page_shift);
      if (_Var2) {
        bVar5 = (bool)(bVar5 | 0xf < pPVar8[lVar9].page_shift);
        uVar3 = (ulong)(iVar10 + 1);
        pPVar7->enc[iVar10] = pPVar8[lVar9];
      }
    }
    for (; uVar3 < 8; uVar3 = uVar3 + 1) {
      pPVar8[uVar3].page_shift = 0;
      pPVar8[uVar3].pte_enc = 0;
    }
    uVar4 = (ulong)(((int)uVar4 + 1) - (uint)(iVar10 == 0));
    pPVar8 = pPVar8 + 9;
  }
  pPVar7 = pPVar1->sps + uVar4;
  for (; uVar4 < 8; uVar4 = uVar4 + 1) {
    pPVar7->enc[5].page_shift = 0;
    pPVar7->enc[5].pte_enc = 0;
    pPVar7->enc[6].page_shift = 0;
    pPVar7->enc[6].pte_enc = 0;
    pPVar7->enc[3].page_shift = 0;
    pPVar7->enc[3].pte_enc = 0;
    pPVar7->enc[4].page_shift = 0;
    pPVar7->enc[4].pte_enc = 0;
    pPVar7->enc[7].page_shift = 0;
    pPVar7->enc[7].pte_enc = 0;
    pPVar7->enc[1].page_shift = 0;
    pPVar7->enc[1].pte_enc = 0;
    pPVar7->enc[2].page_shift = 0;
    pPVar7->enc[2].pte_enc = 0;
    pPVar7->page_shift = 0;
    pPVar7->slb_enc = 0;
    pPVar7->enc[0].page_shift = 0;
    pPVar7->enc[0].pte_enc = 0;
    pPVar7 = pPVar7 + 1;
  }
  if (!bVar5) {
    *(byte *)&pPVar1->flags = (byte)pPVar1->flags & 0xfb;
  }
  return;
}

Assistant:

void ppc_hash64_filter_pagesizes(PowerPCCPU *cpu,
                                 bool (*cb)(void *, uint32_t, uint32_t),
                                 void *opaque)
{
    PPCHash64Options *opts = cpu->hash64_opts;
    int i;
    int n = 0;
    bool ci_largepage = false;

    assert(opts);

    n = 0;
    for (i = 0; i < ARRAY_SIZE(opts->sps); i++) {
        PPCHash64SegmentPageSizes *sps = &opts->sps[i];
        int j;
        int m = 0;

        assert(n <= i);

        if (!sps->page_shift) {
            break;
        }

        for (j = 0; j < ARRAY_SIZE(sps->enc); j++) {
            PPCHash64PageSize *ps = &sps->enc[j];

            assert(m <= j);
            if (!ps->page_shift) {
                break;
            }

            if (cb(opaque, sps->page_shift, ps->page_shift)) {
                if (ps->page_shift >= 16) {
                    ci_largepage = true;
                }
                sps->enc[m++] = *ps;
            }
        }

        /* Clear rest of the row */
        for (j = m; j < ARRAY_SIZE(sps->enc); j++) {
            memset(&sps->enc[j], 0, sizeof(sps->enc[j]));
        }

        if (m) {
            n++;
        }
    }

    /* Clear the rest of the table */
    for (i = n; i < ARRAY_SIZE(opts->sps); i++) {
        memset(&opts->sps[i], 0, sizeof(opts->sps[i]));
    }

    if (!ci_largepage) {
        opts->flags &= ~PPC_HASH64_CI_LARGEPAGE;
    }
}